

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_unittest_main.cc
# Opt level: O2

void gflags::anon_unknown_5::Test_GetCommandLineFlagInfoTest_FlagDoesNotExist::Run(void)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  FlagSaver fs;
  CommandLineFlagInfo local_f8;
  
  FlagSaver::FlagSaver(&fs);
  fprintf(_stderr,"Running test %s/%s\n","GetCommandLineFlagInfoTest","FlagDoesNotExist");
  local_f8.name._M_dataplus._M_p = (pointer)&local_f8.name.field_2;
  local_f8.name._M_string_length = 0;
  local_f8.name.field_2._M_local_buf[0] = '\0';
  local_f8.type._M_dataplus._M_p = (pointer)&local_f8.type.field_2;
  local_f8.type._M_string_length = 0;
  local_f8.type.field_2._M_local_buf[0] = '\0';
  local_f8.description._M_dataplus._M_p = (pointer)&local_f8.description.field_2;
  local_f8.description._M_string_length = 0;
  local_f8.description.field_2._M_local_buf[0] = '\0';
  local_f8.current_value._M_dataplus._M_p = (pointer)&local_f8.current_value.field_2;
  local_f8.current_value._M_string_length = 0;
  local_f8.current_value.field_2._M_local_buf[0] = '\0';
  local_f8.default_value._M_dataplus._M_p = (pointer)&local_f8.default_value.field_2;
  local_f8.default_value._M_string_length = 0;
  local_f8.default_value.field_2._M_local_buf[0] = '\0';
  local_f8.filename._M_dataplus._M_p = (pointer)&local_f8.filename.field_2;
  local_f8.filename._M_string_length = 0;
  local_f8.filename.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::assign((char *)&local_f8);
  std::__cxx11::string::assign((char *)&local_f8.type);
  std::__cxx11::string::assign((char *)&local_f8.current_value);
  std::__cxx11::string::assign((char *)&local_f8.default_value);
  std::__cxx11::string::assign((char *)&local_f8.filename);
  local_f8.has_validator_fn = true;
  local_f8.is_default = false;
  local_f8.flag_ptr = (void *)0x0;
  bVar1 = GetCommandLineFlagInfo("test_int3210",&local_f8);
  if (bVar1) {
    pcVar2 = "!(r)";
    goto LAB_00137c02;
  }
  bVar1 = std::operator==("name",&local_f8.name);
  if (bVar1) {
    bVar1 = std::operator==("type",&local_f8.type);
    if (bVar1) {
      bVar1 = std::operator==("",&local_f8.description);
      if (bVar1) {
        bVar1 = std::operator==("curr",&local_f8.current_value);
        if (bVar1) {
          bVar1 = std::operator==("def",&local_f8.default_value);
          if (bVar1) {
            bVar1 = std::operator==("/",&local_f8.filename);
            if (bVar1) {
              if (local_f8.is_default == true) {
                pcVar2 = "!(info.is_default)";
              }
              else {
                if (local_f8.has_validator_fn != false) {
                  if (local_f8.flag_ptr == (void *)0x0) {
                    CommandLineFlagInfo::~CommandLineFlagInfo(&local_f8);
                    FlagSaver::~FlagSaver(&fs);
                    return;
                  }
                  pcVar2 = "__null";
                  pcVar3 = "info.flag_ptr";
                  goto LAB_00137c2b;
                }
                pcVar2 = "info.has_validator_fn";
              }
LAB_00137c02:
              fprintf(_stderr,"Check failed: %s\n",pcVar2);
              goto LAB_00137c32;
            }
            pcVar2 = "\"/\"";
            pcVar3 = "info.filename";
          }
          else {
            pcVar2 = "\"def\"";
            pcVar3 = "info.default_value";
          }
        }
        else {
          pcVar2 = "\"curr\"";
          pcVar3 = "info.current_value";
        }
      }
      else {
        pcVar2 = "\"\"";
        pcVar3 = "info.description";
      }
    }
    else {
      pcVar2 = "\"type\"";
      pcVar3 = "info.type";
    }
  }
  else {
    pcVar2 = "\"name\"";
    pcVar3 = "info.name";
  }
LAB_00137c2b:
  fprintf(_stderr,"Check failed: %s %s %s\n",pcVar2,"==",pcVar3);
LAB_00137c32:
  exit(1);
}

Assistant:

TEST(GetCommandLineFlagInfoTest, FlagDoesNotExist) {
  CommandLineFlagInfo info;
  // Set to some random values that GetCommandLineFlagInfo should not change
  info.name = "name";
  info.type = "type";
  info.current_value = "curr";
  info.default_value = "def";
  info.filename = "/";
  info.is_default = false;
  info.has_validator_fn = true;
  info.flag_ptr = NULL;
  bool r = GetCommandLineFlagInfo("test_int3210", &info);
  EXPECT_FALSE(r);
  EXPECT_EQ("name", info.name);
  EXPECT_EQ("type", info.type);
  EXPECT_EQ("", info.description);
  EXPECT_EQ("curr", info.current_value);
  EXPECT_EQ("def", info.default_value);
  EXPECT_EQ("/", info.filename);
  EXPECT_FALSE(info.is_default);
  EXPECT_TRUE(info.has_validator_fn);
  EXPECT_EQ(NULL, info.flag_ptr);
}